

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramCombineEntropyBin
               (VP8LHistogramSet *image_histo,VP8LHistogram *cur_combo,int num_bins,
               int32_t combine_cost_factor,int low_effort)

{
  VP8LHistogram **ppVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int in_ECX;
  int in_EDX;
  VP8LHistogram *in_RSI;
  VP8LHistogramSet *in_RDI;
  int in_R8D;
  bool bVar6;
  bool bVar7;
  int try_combine;
  int max_combine_failures;
  int64_t bit_cost_thresh;
  uint64_t bit_cost;
  int first;
  int bin_id;
  anon_struct_4_2_be341b0f bin_info [64];
  int idx;
  VP8LHistogram **histograms;
  VP8LHistogram *in_stack_fffffffffffffeb0;
  VP8LHistogram *in_stack_fffffffffffffec8;
  VP8LHistogram *in_stack_fffffffffffffed0;
  VP8LHistogram *in_stack_fffffffffffffed8;
  VP8LHistogram *in_stack_fffffffffffffee0;
  VP8LHistogram *in_stack_fffffffffffffee8;
  int local_2c;
  VP8LHistogram *local_10;
  VP8LHistogramSet *local_8;
  
  ppVVar1 = in_RDI->histograms;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    *(undefined2 *)(&stack0xfffffffffffffec8 + (long)local_2c * 4) = 0xffff;
    *(undefined2 *)(&stack0xfffffffffffffeca + (long)local_2c * 4) = 0;
  }
  local_2c = 0;
  while (local_2c < local_8->size) {
    uVar2 = (uint)ppVVar1[local_2c]->bin_id;
    iVar3 = (int)*(short *)(&stack0xfffffffffffffec8 + (long)(int)uVar2 * 4);
    if (iVar3 == -1) {
      *(short *)(&stack0xfffffffffffffec8 + (long)(int)uVar2 * 4) = (short)local_2c;
      local_2c = local_2c + 1;
    }
    else if (in_R8D == 0) {
      iVar5 = DivRound(ppVVar1[local_2c]->bit_cost * (long)in_ECX,100);
      in_stack_fffffffffffffeb0 = (VP8LHistogram *)-iVar5;
      iVar4 = HistogramAddEval(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffed8,(int64_t)in_stack_fffffffffffffed0);
      if (iVar4 == 0) {
        local_2c = local_2c + 1;
      }
      else {
        bVar6 = false;
        if ((local_10->trivial_symbol[1] != 0xffff) &&
           (bVar6 = false, local_10->trivial_symbol[2] != 0xffff)) {
          bVar6 = local_10->trivial_symbol[3] != 0xffff;
        }
        if (!bVar6) {
          bVar7 = true;
          if ((ppVVar1[local_2c]->trivial_symbol[1] != 0xffff) &&
             (bVar7 = true, ppVVar1[local_2c]->trivial_symbol[2] != 0xffff)) {
            bVar7 = ppVVar1[local_2c]->trivial_symbol[3] == 0xffff;
          }
          bVar6 = true;
          if ((ppVVar1[iVar3]->trivial_symbol[1] != 0xffff) &&
             (bVar6 = true, ppVVar1[iVar3]->trivial_symbol[2] != 0xffff)) {
            bVar6 = ppVVar1[iVar3]->trivial_symbol[3] == 0xffff;
          }
          bVar6 = (bool)(bVar6 & bVar7);
        }
        if ((bVar6) || (0x1f < *(ushort *)(&stack0xfffffffffffffeca + (long)(int)uVar2 * 4))) {
          HistogramSwap(&local_10,ppVVar1 + iVar3);
          HistogramSetRemoveHistogram(local_8,local_2c);
        }
        else {
          *(short *)(&stack0xfffffffffffffeca + (long)(int)uVar2 * 4) =
               *(short *)(&stack0xfffffffffffffeca + (long)(int)uVar2 * 4) + 1;
          local_2c = local_2c + 1;
        }
      }
    }
    else {
      HistogramAdd(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (VP8LHistogram *)(ulong)CONCAT24(ppVVar1[local_2c]->bin_id,iVar3));
      HistogramSetRemoveHistogram(local_8,local_2c);
    }
  }
  if (in_R8D != 0) {
    for (local_2c = 0; local_2c < local_8->size; local_2c = local_2c + 1) {
      ComputeHistogramCost(in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

static void HistogramCombineEntropyBin(VP8LHistogramSet* const image_histo,
                                       VP8LHistogram* cur_combo, int num_bins,
                                       int32_t combine_cost_factor,
                                       int low_effort) {
  VP8LHistogram** const histograms = image_histo->histograms;
  int idx;
  struct {
    int16_t first;    // position of the histogram that accumulates all
                      // histograms with the same bin_id
    uint16_t num_combine_failures;   // number of combine failures per bin_id
  } bin_info[BIN_SIZE];

  assert(num_bins <= BIN_SIZE);
  for (idx = 0; idx < num_bins; ++idx) {
    bin_info[idx].first = -1;
    bin_info[idx].num_combine_failures = 0;
  }

  for (idx = 0; idx < image_histo->size;) {
    const int bin_id = histograms[idx]->bin_id;
    const int first = bin_info[bin_id].first;
    if (first == -1) {
      bin_info[bin_id].first = idx;
      ++idx;
    } else if (low_effort) {
      HistogramAdd(histograms[idx], histograms[first], histograms[first]);
      HistogramSetRemoveHistogram(image_histo, idx);
    } else {
      // try to merge #idx into #first (both share the same bin_id)
      const uint64_t bit_cost = histograms[idx]->bit_cost;
      const int64_t bit_cost_thresh =
          -DivRound((int64_t)bit_cost * combine_cost_factor, 100);
      if (HistogramAddEval(histograms[first], histograms[idx], cur_combo,
                           bit_cost_thresh)) {
        const int max_combine_failures = 32;
        // Try to merge two histograms only if the combo is a trivial one or
        // the two candidate histograms are already non-trivial.
        // For some images, 'try_combine' turns out to be false for a lot of
        // histogram pairs. In that case, we fallback to combining
        // histograms as usual to avoid increasing the header size.
        int try_combine =
            cur_combo->trivial_symbol[RED] != VP8L_NON_TRIVIAL_SYM &&
            cur_combo->trivial_symbol[BLUE] != VP8L_NON_TRIVIAL_SYM &&
            cur_combo->trivial_symbol[ALPHA] != VP8L_NON_TRIVIAL_SYM;
        if (!try_combine) {
          try_combine =
              histograms[idx]->trivial_symbol[RED] == VP8L_NON_TRIVIAL_SYM ||
              histograms[idx]->trivial_symbol[BLUE] == VP8L_NON_TRIVIAL_SYM ||
              histograms[idx]->trivial_symbol[ALPHA] == VP8L_NON_TRIVIAL_SYM;
          try_combine &=
              histograms[first]->trivial_symbol[RED] == VP8L_NON_TRIVIAL_SYM ||
              histograms[first]->trivial_symbol[BLUE] == VP8L_NON_TRIVIAL_SYM ||
              histograms[first]->trivial_symbol[ALPHA] == VP8L_NON_TRIVIAL_SYM;
        }
        if (try_combine ||
            bin_info[bin_id].num_combine_failures >= max_combine_failures) {
          // move the (better) merged histogram to its final slot
          HistogramSwap(&cur_combo, &histograms[first]);
          HistogramSetRemoveHistogram(image_histo, idx);
        } else {
          ++bin_info[bin_id].num_combine_failures;
          ++idx;
        }
      } else {
        ++idx;
      }
    }
  }
  if (low_effort) {
    // for low_effort case, update the final cost when everything is merged
    for (idx = 0; idx < image_histo->size; ++idx) {
      ComputeHistogramCost(histograms[idx]);
    }
  }
}